

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

wchar_t __thiscall CharFieldSourceString::getch(CharFieldSourceString *this)

{
  utf8_ptr *in_RDI;
  wchar_t ch;
  undefined4 in_stack_ffffffffffffffe8;
  wchar_t local_4;
  
  if (in_RDI[2].p_ == (char *)0x0) {
    local_4 = L'\0';
  }
  else {
    local_4 = utf8_ptr::getch((utf8_ptr *)0x32a9b8);
    utf8_ptr::inc(in_RDI,(size_t *)CONCAT44(local_4,in_stack_ffffffffffffffe8));
  }
  return local_4;
}

Assistant:

virtual wchar_t getch()
    {
        if (len != 0)
        {
            wchar_t ch = p.getch();
            p.inc(&len);
            return ch;
        }
        else
            return 0;
    }